

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O1

int run_test_poll_oob(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  uv_idle_t *loop;
  int *piVar4;
  ssize_t sVar5;
  uint extraout_EDX;
  char *unaff_RBX;
  uv_tcp_t *puVar6;
  uv_poll_t *puVar7;
  int *unaff_R14;
  sockaddr_in *unaff_R15;
  sockaddr_in *psVar8;
  sockaddr_in addr;
  undefined1 auStack_6c [20];
  int *piStack_58;
  undefined1 *puStack_50;
  sockaddr_in sStack_28;
  
  psVar8 = &sStack_28;
  puVar6 = (uv_tcp_t *)0x1a4b5a;
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_28);
  if (iVar1 == 0) {
    unaff_RBX = (char *)uv_default_loop();
    iVar2 = 0x3290e0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&server_handle);
    if (iVar1 != 0) goto LAB_00164866;
    iVar2 = 0x3291d8;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&client_handle);
    if (iVar1 != 0) goto LAB_0016486b;
    iVar2 = 0x3292d0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&peer_handle);
    if (iVar1 != 0) goto LAB_00164870;
    iVar2 = 0x3293c8;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_idle_init((uv_loop_t *)unaff_RBX,&idle);
    if (iVar1 != 0) goto LAB_00164875;
    puVar6 = &server_handle;
    iVar2 = (int)&sStack_28;
    iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&sStack_28,0);
    if (iVar1 != 0) goto LAB_0016487a;
    puVar6 = &server_handle;
    iVar2 = 1;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
    if (iVar1 != 0) goto LAB_0016487f;
    puVar6 = &client_handle;
    iVar2 = 1;
    iVar1 = uv_tcp_nodelay(&client_handle,1);
    if (iVar1 != 0) goto LAB_00164884;
    puVar6 = (uv_tcp_t *)0x2;
    iVar2 = 1;
    client_fd = socket(2,1,0);
    if (client_fd < 0) goto LAB_00164889;
    unaff_R14 = __errno_location();
    do {
      *unaff_R14 = 0;
      puVar6 = (uv_tcp_t *)(ulong)(uint)client_fd;
      iVar2 = (int)&sStack_28;
      iVar1 = connect(client_fd,(sockaddr *)&sStack_28,0x10);
      if (iVar1 != -1) break;
    } while (*unaff_R14 == 4);
    if (iVar1 != 0) {
      run_test_poll_oob_cold_16();
      unaff_R15 = &sStack_28;
      goto LAB_00164861;
    }
    iVar2 = 0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016488e;
    psVar8 = &sStack_28;
    if (ticks != 10) goto LAB_00164893;
    psVar8 = &sStack_28;
    if (cli_pr_check == '\0') goto LAB_00164898;
    psVar8 = &sStack_28;
    if (cli_rd_check != 2) goto LAB_0016489d;
    psVar8 = &sStack_28;
    if (srv_rd_check == '\0') goto LAB_001648a2;
    unaff_RBX = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar6 = (uv_tcp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)puVar6);
    psVar8 = &sStack_28;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00164861:
    run_test_poll_oob_cold_1();
LAB_00164866:
    run_test_poll_oob_cold_2();
LAB_0016486b:
    run_test_poll_oob_cold_3();
LAB_00164870:
    run_test_poll_oob_cold_4();
LAB_00164875:
    run_test_poll_oob_cold_5();
LAB_0016487a:
    run_test_poll_oob_cold_6();
LAB_0016487f:
    run_test_poll_oob_cold_7();
LAB_00164884:
    run_test_poll_oob_cold_8();
LAB_00164889:
    psVar8 = unaff_R15;
    run_test_poll_oob_cold_9();
LAB_0016488e:
    run_test_poll_oob_cold_10();
LAB_00164893:
    run_test_poll_oob_cold_11();
LAB_00164898:
    run_test_poll_oob_cold_12();
LAB_0016489d:
    run_test_poll_oob_cold_13();
LAB_001648a2:
    run_test_poll_oob_cold_14();
  }
  run_test_poll_oob_cold_15();
  if (iVar2 == 0) {
    iVar2 = uv_accept((uv_stream_t *)puVar6,(uv_stream_t *)&peer_handle);
    loop = (uv_idle_t *)puVar6;
    if (iVar2 != 0) goto LAB_001649fa;
    puVar6 = &peer_handle;
    iVar2 = uv_fileno((uv_handle_t *)&peer_handle,&server_fd);
    loop = (uv_idle_t *)puVar6;
    if (iVar2 != 0) goto LAB_001649ff;
    loop = (uv_idle_t *)uv_default_loop();
    iVar2 = uv_poll_init_socket((uv_loop_t *)loop,poll_req,client_fd);
    if (iVar2 != 0) goto LAB_00164a04;
    loop = (uv_idle_t *)uv_default_loop();
    iVar2 = uv_poll_init_socket((uv_loop_t *)loop,poll_req + 1,server_fd);
    if (iVar2 != 0) goto LAB_00164a09;
    puVar7 = poll_req;
    iVar2 = uv_poll_start(poll_req,0xb,poll_cb);
    loop = (uv_idle_t *)puVar7;
    if (iVar2 != 0) goto LAB_00164a0e;
    loop = (uv_idle_t *)(poll_req + 1);
    iVar2 = uv_poll_start(poll_req + 1,1,poll_cb);
    if (iVar2 != 0) goto LAB_00164a13;
    unaff_RBX = "hello";
    do {
      loop = (uv_idle_t *)(ulong)(uint)server_fd;
      unaff_R14 = (int *)send(server_fd,"hello",5,1);
      if (-1 < (int)unaff_R14) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((int)unaff_R14 != 5) goto LAB_00164a18;
    unaff_RBX = "world";
    do {
      loop = (uv_idle_t *)(ulong)(uint)server_fd;
      unaff_R14 = (int *)send(server_fd,"world",5,0);
      if (-1 < (int)unaff_R14) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((int)unaff_R14 != 5) goto LAB_00164a1d;
    loop = &idle;
    iVar2 = uv_idle_start(&idle,idle_cb);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    connection_cb_cold_1();
    loop = (uv_idle_t *)puVar6;
LAB_001649fa:
    connection_cb_cold_2();
LAB_001649ff:
    connection_cb_cold_3();
LAB_00164a04:
    connection_cb_cold_4();
LAB_00164a09:
    connection_cb_cold_5();
LAB_00164a0e:
    connection_cb_cold_6();
LAB_00164a13:
    connection_cb_cold_7();
LAB_00164a18:
    connection_cb_cold_8();
LAB_00164a1d:
    connection_cb_cold_9();
  }
  connection_cb_cold_10();
  auStack_6c._12_8_ = unaff_RBX;
  piStack_58 = unaff_R14;
  puStack_50 = (undefined1 *)psVar8;
  iVar2 = uv_fileno((uv_handle_t *)loop,(uv_os_fd_t *)(auStack_6c + 8));
  if (iVar2 == 0) {
    auStack_6c[4] = '\0';
    auStack_6c._0_4_ = 0;
    uVar3 = 0;
    if ((extraout_EDX & 8) != 0) {
      do {
        loop = (uv_idle_t *)(ulong)(uint)client_fd;
        sVar5 = recv(client_fd,auStack_6c,5,1);
        if ((int)sVar5 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if ((-1 < (int)sVar5) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
        cli_pr_check = '\x01';
        puVar7 = poll_req;
        iVar2 = uv_poll_stop(poll_req);
        loop = (uv_idle_t *)puVar7;
        if (iVar2 != 0) goto LAB_00164cd6;
        puVar7 = poll_req;
        uVar3 = uv_poll_start(poll_req,3,poll_cb);
        loop = (uv_idle_t *)puVar7;
        if (uVar3 == 0) goto LAB_00164ad5;
        goto LAB_00164cdb;
      }
      goto LAB_00164cef;
    }
LAB_00164ad5:
    if ((extraout_EDX & 1) == 0) goto LAB_00164c88;
    if (auStack_6c._8_4_ != client_fd) goto LAB_00164c09;
    do {
      loop = (uv_idle_t *)(ulong)(uint)client_fd;
      sVar5 = recv(client_fd,auStack_6c,5,0);
      iVar2 = (int)sVar5;
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((iVar2 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) goto LAB_00164cfe;
    if (cli_rd_check == 1) {
      loop = (uv_idle_t *)auStack_6c;
      iVar1 = strncmp((char *)loop,"world",(long)iVar2);
      if (iVar1 != 0) goto LAB_00164cf4;
      if (iVar2 == 5) {
        cli_rd_check = 2;
        goto LAB_00164b67;
      }
      goto LAB_00164cf9;
    }
LAB_00164b67:
    if (cli_rd_check == 0) {
      if (iVar2 != 4) goto LAB_00164d03;
      if (auStack_6c._0_4_ == 0x6c6c6568) {
        iVar2 = 1;
LAB_00164ba1:
        do {
          cli_rd_check = iVar2;
          loop = (uv_idle_t *)(ulong)(uint)server_fd;
          sVar5 = recv(server_fd,auStack_6c,5,0);
          iVar1 = (int)sVar5;
          if (iVar1 == -1) {
            piVar4 = __errno_location();
            iVar2 = cli_rd_check;
            if (*piVar4 == 4) goto LAB_00164ba1;
          }
          if (iVar1 < 1) goto LAB_00164bf4;
          if (iVar1 != 5) {
            poll_cb_cold_14();
            goto LAB_00164cd1;
          }
          iVar2 = 2;
        } while (auStack_6c[4] == 'd' && auStack_6c._0_4_ == 0x6c726f77);
        poll_cb_cold_15();
LAB_00164bf4:
        piVar4 = __errno_location();
        if ((*piVar4 != 0xb) && (*piVar4 != 0x73)) goto LAB_00164d12;
        goto LAB_00164c09;
      }
      goto LAB_00164d08;
    }
LAB_00164c09:
    uVar3 = auStack_6c._8_4_;
    if (auStack_6c._8_4_ != server_fd) {
LAB_00164c88:
      if ((extraout_EDX & 2) == 0) {
        return uVar3;
      }
      do {
        loop = (uv_idle_t *)(ulong)(uint)client_fd;
        piVar4 = (int *)send(client_fd,"foo",3,0);
        iVar2 = (int)piVar4;
        if (-1 < iVar2) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if (iVar2 == 3) {
        return (int)piVar4;
      }
      goto LAB_00164ce0;
    }
    do {
      loop = (uv_idle_t *)(ulong)(uint)server_fd;
      sVar5 = recv(server_fd,auStack_6c,3,0);
      iVar2 = (int)sVar5;
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((-1 < iVar2) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
      if (iVar2 != 3) goto LAB_00164ce5;
      if (auStack_6c[2] == 'o' && (short)auStack_6c._0_4_ == 0x6f66) {
        srv_rd_check = '\x01';
        uVar3 = uv_poll_stop(poll_req + 1);
        goto LAB_00164c88;
      }
      goto LAB_00164cea;
    }
  }
  else {
LAB_00164cd1:
    poll_cb_cold_1();
LAB_00164cd6:
    poll_cb_cold_3();
LAB_00164cdb:
    poll_cb_cold_4();
LAB_00164ce0:
    poll_cb_cold_16();
LAB_00164ce5:
    poll_cb_cold_11();
LAB_00164cea:
    poll_cb_cold_12();
LAB_00164cef:
    poll_cb_cold_2();
LAB_00164cf4:
    poll_cb_cold_6();
LAB_00164cf9:
    poll_cb_cold_7();
LAB_00164cfe:
    poll_cb_cold_5();
LAB_00164d03:
    poll_cb_cold_8();
LAB_00164d08:
    poll_cb_cold_9();
  }
  poll_cb_cold_10();
LAB_00164d12:
  poll_cb_cold_13();
  uv_sleep(100);
  iVar2 = ticks;
  ticks = ticks + 1;
  if (iVar2 < 9) {
    return iVar2;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(poll_req + 1);
  uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&client_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&peer_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT(client_fd >= 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT(r == 0);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT(cli_pr_check == 1);
  /* Did client receive the POLLIN message */
  ASSERT(cli_rd_check == 2);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT(srv_rd_check == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}